

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68020_bfffo(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint in_EDI;
  bool bVar4;
  char width [3];
  char offset [3];
  char local_e [3];
  char local_b [3];
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar1 = dasm_read_imm_16(in_EDI);
    bVar4 = (uVar1 >> 0xb & 1) == 0;
    uVar2 = 7;
    if (bVar4) {
      uVar2 = 0x1f;
    }
    pcVar3 = "D%d";
    if (bVar4) {
      pcVar3 = "%d";
    }
    sprintf(local_b,pcVar3,(ulong)(uVar2 & uVar1 >> 6));
    if ((uVar1 & 0x20) == 0) {
      uVar2 = g_5bit_data_table[uVar1 & 0x1f];
      pcVar3 = "%d";
    }
    else {
      uVar2 = uVar1 & 7;
      pcVar3 = "D%d";
    }
    sprintf(local_e,pcVar3,(ulong)uVar2);
    pcVar3 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"bfffo   %s {%s:%s}, D%d; (2+)",pcVar3,local_b,local_e,
            (ulong)(uVar1 >> 0xc & 7));
    return;
  }
  if ((~g_cpu_ir & 0xf000) == 0) {
    pcVar3 = "dc.w    $%04x; opcode 1111";
  }
  else {
    pcVar3 = "dc.w $%04x; ILLEGAL";
  }
  sprintf(g_dasm_str,pcVar3);
  return;
}

Assistant:

static void d68020_bfffo(void)
{
	uint extension;
	char offset[3];
	char width[3];

	LIMIT_CPU_TYPES(M68020_PLUS);

	extension = read_imm_16();

	if(BIT_B(extension))
		sprintf(offset, "D%d", (extension>>6)&7);
	else
		sprintf(offset, "%d", (extension>>6)&31);
	if(BIT_5(extension))
		sprintf(width, "D%d", extension&7);
	else
		sprintf(width, "%d", g_5bit_data_table[extension&31]);
	sprintf(g_dasm_str, "bfffo   %s {%s:%s}, D%d; (2+)", get_ea_mode_str_8(g_cpu_ir), offset, width, (extension>>12)&7);
}